

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

atomBins *
binAtoms(atom *theAtoms,region *boundingBox,char serialNum,float probeRad,int keepUnselected,
        int selflags)

{
  atomBins *bins_00;
  float fVar1;
  atomBins *bins;
  atom *a;
  int selflags_local;
  int keepUnselected_local;
  float probeRad_local;
  char serialNum_local;
  region *boundingBox_local;
  atom *theAtoms_local;
  
  fVar1 = getMaxRadius(ImplicitH);
  bins_00 = initBins(serialNum,boundingBox,fVar1 + probeRad + fVar1 + probeRad + 0.2);
  bins = (atomBins *)theAtoms;
  if (bins_00 != (atomBins *)0x0) {
    for (; bins != (atomBins *)0x0; bins = (atomBins *)(bins->min).x) {
      if (((keepUnselected != 0) || ((*(uint *)((long)&(bins->max).y + 4) & selflags) != 0)) &&
         (((ulong)(bins->max).y & 0x400000000) == 0)) {
        addNeighbor((atom *)bins,bins_00);
      }
    }
  }
  return bins_00;
}

Assistant:

atomBins* binAtoms(atom *theAtoms, region *boundingBox, char serialNum,
		  float probeRad, int keepUnselected, int selflags)
{
   atom *a = NULL;
   atomBins *bins = NULL;

   bins = initBins(serialNum, boundingBox,
	    2.0f*(getMaxRadius(ImplicitH)+probeRad)+0.2f);
   if (bins) {
      for(a = theAtoms; a; a = a->next) {
	 if (keepUnselected || (a->flags & selflags)) {
	    if (! (a->flags & IGNORE_FLAG)) {
	       addNeighbor(a, bins);
	    }
            /*050118 this seems the only place that uses IGNORE_FLAG*/
	 }
      }
   }
   /* note: addNeighbor() also called in updateHydrogenInfo() */
   return bins;
}